

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void __thiscall FWeaponSlot::Sort(FWeaponSlot *this)

{
  undefined8 *puVar1;
  int iVar2;
  PClassWeapon *pPVar3;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  WeaponInfo *pWVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  if (1 < (int)(this->Weapons).Count) {
    pWVar8 = (this->Weapons).Array;
    uVar6 = 1;
    lVar7 = 0x10;
    do {
      iVar2 = pWVar8[uVar6].Position;
      pPVar3 = pWVar8[uVar6].Type;
      lVar10 = lVar7;
      uVar11 = uVar6;
      do {
        uVar9 = uVar11 - 1 & 0xffffffff;
        pWVar8 = (this->Weapons).Array;
        if (pWVar8[uVar9].Position <= iVar2) goto LAB_004ad4e6;
        uVar5 = *(undefined8 *)&pWVar8[uVar9].Position;
        puVar1 = (undefined8 *)((long)&pWVar8->Type + lVar10);
        *puVar1 = pWVar8[uVar9].Type;
        puVar1[1] = uVar5;
        lVar10 = lVar10 + -0x10;
        bVar4 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar4);
      pWVar8 = (this->Weapons).Array;
      uVar11 = 0;
LAB_004ad4e6:
      pWVar8[uVar11].Type = pPVar3;
      pWVar8[uVar11].Position = iVar2;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while ((long)uVar6 < (long)(int)(this->Weapons).Count);
  }
  return;
}

Assistant:

void FWeaponSlot::Sort()
{
	// This does not use qsort(), because the sort should be stable, and
	// there is no guarantee that qsort() is stable. This insertion sort
	// should be fine.
	int i, j;

	for (i = 1; i < (int)Weapons.Size(); ++i)
	{
		int pos = Weapons[i].Position;
		PClassWeapon *type = Weapons[i].Type;
		for (j = i - 1; j >= 0 && Weapons[j].Position > pos; --j)
		{
			Weapons[j + 1] = Weapons[j];
		}
		Weapons[j + 1].Type = type;
		Weapons[j + 1].Position = pos;
	}
}